

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kfpu.c
# Opt level: O1

void WRITE_EA_PACK(int ea,int k,floatx80 fpr)

{
  uint uVar1;
  ulong uVar2;
  uint ea_00;
  uint uVar3;
  
  uVar3 = (uint)ea >> 3 & 7;
  uVar2 = (ulong)uVar3;
  uVar1 = ea & 7;
  switch(uVar3) {
  case 2:
    ea_00 = m68ki_cpu.dar[(ulong)uVar1 + 8];
    break;
  case 3:
    store_pack_float80(m68ki_cpu.dar[(ulong)uVar1 + 8],k,fpr);
    m68ki_cpu.dar[(ulong)uVar1 + 8] = m68ki_cpu.dar[(ulong)uVar1 + 8] + 0xc;
    return;
  case 4:
    ea_00 = m68ki_cpu.dar[(ulong)uVar1 + 8] - 0xc;
    m68ki_cpu.dar[(ulong)uVar1 + 8] = ea_00;
    break;
  default:
    goto LAB_003f9109;
  case 7:
    uVar2 = 7;
LAB_003f9109:
    fatalerror("M68kFPU: WRITE_EA_PACK: unhandled mode %d, reg %d, at %08X\n",uVar2,(ulong)uVar1,
               (ulong)m68ki_cpu.pc);
  }
  store_pack_float80(ea_00,k,fpr);
  return;
}

Assistant:

static void WRITE_EA_PACK(int ea, int k, floatx80 fpr)
{
	int mode = (ea >> 3) & 0x7;
	int reg = (ea & 0x7);

	switch (mode)
	{
		case 2:		// (An)
		{
			uint32 ea;
			ea = REG_A[reg];
			store_pack_float80(ea, k, fpr);
			break;
		}

		case 3:		// (An)+
		{
			uint32 ea;
			ea = REG_A[reg];
			store_pack_float80(ea, k, fpr);
			REG_A[reg] += 12;
			break;
		}

		case 4:		// -(An)
		{
			uint32 ea;
			REG_A[reg] -= 12;
			ea = REG_A[reg];
			store_pack_float80(ea, k, fpr);
			break;
		}

		case 7:
		{
			switch (reg)
			{
				default:	fatalerror("M68kFPU: WRITE_EA_PACK: unhandled mode %d, reg %d, at %08X\n", mode, reg, REG_PC);
			}
		}
		break;
		default:	fatalerror("M68kFPU: WRITE_EA_PACK: unhandled mode %d, reg %d, at %08X\n", mode, reg, REG_PC);
	}
}